

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O3

int Abc_NtkMfsSolveSat(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  uint *Sign;
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  
  p->vProjVarsSat->nSize = 0;
  uVar7 = p->pAigWin->nObjs[3] - (pNode->vFanins).nSize;
  pVVar5 = p->pAigWin->vCos;
  if ((int)uVar7 < pVVar5->nSize) {
    uVar8 = (ulong)uVar7;
    do {
      if ((int)uVar7 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar3 = p->pCnf->pVarNums[*(int *)((long)pVVar5->pArray[uVar8] + 0x24)];
      if (iVar3 < 0) {
        __assert_fail("p->pCnf->pVarNums[pObjPo->Id] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsSat.c"
                      ,0x67,"int Abc_NtkMfsSolveSat(Mfs_Man_t *, Abc_Obj_t *)");
      }
      pVVar2 = p->vProjVarsSat;
      uVar4 = pVVar2->nSize;
      if (uVar4 == pVVar2->nCap) {
        if ((int)uVar4 < 0x10) {
          if (pVVar2->pArray == (int *)0x0) {
            piVar6 = (int *)malloc(0x40);
          }
          else {
            piVar6 = (int *)realloc(pVVar2->pArray,0x40);
          }
          pVVar2->pArray = piVar6;
          if (piVar6 == (int *)0x0) {
LAB_0044ef27:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar2->nCap = 0x10;
        }
        else {
          if (pVVar2->pArray == (int *)0x0) {
            piVar6 = (int *)malloc((ulong)uVar4 * 8);
          }
          else {
            piVar6 = (int *)realloc(pVVar2->pArray,(ulong)uVar4 * 8);
          }
          pVVar2->pArray = piVar6;
          if (piVar6 == (int *)0x0) goto LAB_0044ef27;
          pVVar2->nCap = uVar4 * 2;
        }
      }
      else {
        piVar6 = pVVar2->pArray;
      }
      iVar1 = pVVar2->nSize;
      pVVar2->nSize = iVar1 + 1;
      piVar6[iVar1] = iVar3;
      uVar8 = uVar8 + 1;
      pVVar5 = p->pAigWin->vCos;
    } while ((int)uVar8 < pVVar5->nSize);
    iVar1 = p->vProjVarsSat->nSize;
    p->nFanins = iVar1;
    iVar3 = 1 << ((char)iVar1 - 5U & 0x1f);
    if (iVar1 < 6) {
      iVar3 = 1;
    }
  }
  else {
    p->nFanins = 0;
    iVar3 = 1;
  }
  p->nWords = iVar3;
  Sign = p->uCare;
  memset(Sign,0,(long)iVar3 << 2);
  p->nCares = 0;
  p->nTotConfLim = p->pPars->nBTLimit;
  do {
    iVar3 = Abc_NtkMfsSolveSat_iter(p);
  } while (iVar3 == 1);
  if (iVar3 == -1) {
    return 0;
  }
  p->nMintsCare = p->nMintsCare + p->nCares;
  iVar3 = p->nFanins;
  uVar7 = 1 << ((byte)iVar3 & 0x1f);
  p->nMintsTotal = p->nMintsTotal + uVar7;
  if (p->pPars->fVeryVerbose != 0) {
    printf("Node %4d : Care = %2d. Total = %2d.  ",(ulong)(uint)pNode->Id,(ulong)(uint)p->nCares,
           (ulong)uVar7);
    Extra_PrintBinary(_stdout,Sign,1 << ((byte)p->nFanins & 0x1f));
    putchar(10);
    iVar3 = p->nFanins;
  }
  if (4 < iVar3) {
    return 1;
  }
  switch(iVar3) {
  case 1:
    __assert_fail("p->nFanins != 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsSat.c"
                  ,0x8c,"int Abc_NtkMfsSolveSat(Mfs_Man_t *, Abc_Obj_t *)");
  case 2:
    uVar7 = *Sign;
    uVar4 = uVar7 << 0x1c | uVar7 << 0x18 | uVar7 << 0x14 |
            uVar7 << 0x10 | uVar7 << 0xc | uVar7 << 8 | uVar7 << 4;
    break;
  case 3:
    uVar7 = *Sign;
    uVar4 = uVar7 << 0x18 | uVar7 | uVar7 << 0x10 | uVar7 << 8;
    goto LAB_0044eed5;
  case 4:
    uVar7 = *Sign;
    uVar4 = uVar7 << 0x10;
    break;
  default:
    goto switchD_0044ee7d_default;
  }
  uVar4 = uVar4 | uVar7;
LAB_0044eed5:
  *Sign = uVar4;
switchD_0044ee7d_default:
  return 1;
}

Assistant:

int Abc_NtkMfsSolveSat( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Aig_Obj_t * pObjPo;
    int RetValue, i;
    // collect projection variables
    Vec_IntClear( p->vProjVarsSat );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, p->pAigWin->vCos, pObjPo, i, Aig_ManCoNum(p->pAigWin) - Abc_ObjFaninNum(pNode) )
    {
        assert( p->pCnf->pVarNums[pObjPo->Id] >= 0 );
        Vec_IntPush( p->vProjVarsSat, p->pCnf->pVarNums[pObjPo->Id] );
    }

    // prepare the truth table of care set
    p->nFanins = Vec_IntSize( p->vProjVarsSat );
    p->nWords = Abc_TruthWordNum( p->nFanins );
    memset( p->uCare, 0, sizeof(unsigned) * p->nWords );

    // iterate through the SAT assignments
    p->nCares = 0;
    p->nTotConfLim = p->pPars->nBTLimit;
    while ( (RetValue = Abc_NtkMfsSolveSat_iter(p)) == 1 );
    if ( RetValue == -1 )
        return 0;

    // write statistics
    p->nMintsCare  += p->nCares;
    p->nMintsTotal += (1<<p->nFanins);

    if ( p->pPars->fVeryVerbose )
    {
        printf( "Node %4d : Care = %2d. Total = %2d.  ", pNode->Id, p->nCares, (1<<p->nFanins) );
        Extra_PrintBinary( stdout, p->uCare, (1<<p->nFanins) );
        printf( "\n" );
    }

    // map the care 
    if ( p->nFanins > 4 )
        return 1;
    if ( p->nFanins == 4 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] << 16);
    if ( p->nFanins == 3 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] << 8) | (p->uCare[0] << 16) | (p->uCare[0] << 24);
    if ( p->nFanins == 2 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] <<  4) | (p->uCare[0] <<  8) | (p->uCare[0] << 12) |
              (p->uCare[0] << 16) | (p->uCare[0] << 20) | (p->uCare[0] << 24) | (p->uCare[0] << 28);
    assert( p->nFanins != 1 );
    return 1;
}